

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getkey.c
# Opt level: O0

int ffgkey(fitsfile *fptr,char *keyname,char *keyval,char *comm,int *status)

{
  int iVar1;
  undefined1 *in_RCX;
  undefined1 *in_RDX;
  int *in_R8;
  char card [81];
  int *in_stack_00000090;
  char *in_stack_00000098;
  char *in_stack_000000a0;
  fitsfile *in_stack_000000a8;
  undefined4 local_4;
  
  *in_RDX = 0;
  if (in_RCX != (undefined1 *)0x0) {
    *in_RCX = 0;
  }
  if (*in_R8 < 1) {
    iVar1 = ffgcrd(in_stack_000000a8,in_stack_000000a0,in_stack_00000098,in_stack_00000090);
    if (iVar1 < 1) {
      ffpsvc((char *)card._24_8_,(char *)card._16_8_,(char *)card._8_8_,(int *)card._0_8_);
      local_4 = *in_R8;
    }
    else {
      local_4 = *in_R8;
    }
  }
  else {
    local_4 = *in_R8;
  }
  return local_4;
}

Assistant:

int ffgkey( fitsfile *fptr,     /* I - FITS file pointer        */
            const char *keyname,      /* I - name of keyword to read  */
            char *keyval,       /* O - keyword value            */
            char *comm,         /* O - keyword comment          */
            int  *status)       /* IO - error status            */
/*
  Read (get) the named keyword, returning the keyword value and comment.
  The value is just the literal string of characters in the value field
  of the keyword.  In the case of a string valued keyword, the returned
  value includes the leading and closing quote characters.  The value may be
  up to 70 characters long, and the comment may be up to 72 characters long.
  If the keyword has no value (no equal sign in column 9) then a null value
  is returned.
*/
{
    char card[FLEN_CARD];

    keyval[0] = '\0';
    if (comm)
       comm[0] = '\0';

    if (*status > 0)
        return(*status);

    if (ffgcrd(fptr, keyname, card, status) > 0)    /* get the 80-byte card */
        return(*status);

    ffpsvc(card, keyval, comm, status);      /* parse the value and comment */

    return(*status);
}